

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TwoStageDynamicBayesianNetwork.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
TwoStageDynamicBayesianNetwork::GetOProbabilitiesExactScopes
          (TwoStageDynamicBayesianNetwork *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *Aii,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *Yii,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *Oii,Index *oIndex)

{
  long *plVar1;
  Index IVar2;
  Scope *this_00;
  size_type sVar3;
  ostream *poVar4;
  undefined8 uVar5;
  allocator_type *__a;
  const_reference ppCVar6;
  reference pvVar7;
  long *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  uint *in_R9;
  value_type extraout_XMM0_Qa;
  value_type vVar8;
  Index valI;
  Index iiI;
  size_t nrVals;
  stringstream errormsg;
  vector<double,_std::allocator<double>_> *probs;
  string *in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda4;
  value_type_conflict3 *__value;
  size_type in_stack_fffffffffffffdb8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffdc0;
  uint local_214;
  undefined1 local_209 [16];
  undefined1 local_1f9;
  allocator_type *local_1f8;
  undefined1 local_1e9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffe40;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffe48;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffe50;
  ostream local_1a8 [4];
  Index in_stack_fffffffffffffe5c;
  TwoStageDynamicBayesianNetwork *in_stack_fffffffffffffe60;
  
  this_00 = GetXSoI_O((TwoStageDynamicBayesianNetwork *)
                      CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                      (Index)((ulong)in_stack_fffffffffffffd98 >> 0x20));
  sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this_00->super_SDT);
  if (sVar3 == 0) {
    plVar1 = (long *)*in_RSI;
    __a = (allocator_type *)
          (**(code **)(*(long *)((long)plVar1 + *(long *)(*plVar1 + -0x188)) + 0xc0))
                    ((long)plVar1 + *(long *)(*plVar1 + -0x188),*in_R9);
    local_1f9 = 0;
    local_209._1_8_ = 0;
    __value = (value_type_conflict3 *)local_209;
    vVar8 = extraout_XMM0_Qa;
    local_1f8 = __a;
    std::allocator<double>::allocator((allocator<double> *)0xaf3a08);
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,__value,__a);
    std::allocator<double>::~allocator((allocator<double> *)0xaf3a2d);
    IVar2 = IndividualToJointOiiIndices
                      (in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c,in_stack_fffffffffffffe50
                       ,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
    for (local_214 = 0; (allocator_type *)(ulong)local_214 < local_1f8; local_214 = local_214 + 1) {
      ppCVar6 = std::vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>::
                operator[]((vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>
                            *)(in_RSI + 0x53),(ulong)*in_R9);
      (*(*ppCVar6)->_vptr_CPDDiscreteInterface[2])(*ppCVar6,(ulong)local_214,(ulong)IVar2);
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,(ulong)local_214);
      *pvVar7 = vVar8;
    }
    return in_RDI;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&stack0xfffffffffffffe48);
  poVar4 = std::operator<<(local_1a8,"Observation Factor ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,*in_R9);
  std::operator<<(poVar4," has a non-null PS SF scope, which was ignored.");
  local_1e9 = 1;
  uVar5 = __cxa_allocate_exception(0x28);
  std::__cxx11::stringstream::str();
  E::E((E *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),in_stack_fffffffffffffd98)
  ;
  local_1e9 = 0;
  __cxa_throw(uVar5,&E::typeinfo,E::~E);
}

Assistant:

vector<double> TwoStageDynamicBayesianNetwork::
GetOProbabilitiesExactScopes( 
                    const vector<Index>& Aii,
                    const vector<Index>& Yii,
                    const vector<Index>& Oii,
                    const Index& oIndex //agentI
                ) const
{
    if(GetXSoI_O(oIndex).size() > 0)
    {
      stringstream errormsg;
      errormsg << "Observation Factor " << oIndex << " has a non-null PS SF scope, which was ignored.";
      throw E(errormsg.str());      
    }
    size_t nrVals = _m_madp->GetNrObservations(oIndex);
    vector<double> probs(nrVals, 0.0);
    Index iiI = IndividualToJointOiiIndices(oIndex, Aii, Yii, Oii);
    for(Index valI=0; valI < nrVals; valI++)
    {
        probs[valI] = _m_O_CPDs[oIndex]->Get(valI, iiI);
    }
    return(probs);
}